

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Simplex_handle __thiscall
Gudhi::Simplex_tree<Low_options>::find<std::initializer_list<unsigned_char>>
          (Simplex_tree<Low_options> *this,initializer_list<unsigned_char> *s)

{
  undefined8 *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> copy;
  allocator_type local_31;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  if (in_RDX[1] == 0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
  }
  else {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_30,(uchar *)*in_RDX,
               (uchar *)*in_RDX + in_RDX[1],&local_31);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30._M_impl.super__Vector_impl_data._M_start,
               local_30._M_impl.super__Vector_impl_data._M_finish);
    find_simplex(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)s);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  }
  return (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }